

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

void __thiscall
slang::ast::BinaryAssertionExpr::serializeTo(BinaryAssertionExpr *this,ASTSerializer *serializer)

{
  string_view sVar1;
  
  sVar1 = ast::toString(this->op);
  ASTSerializer::write(serializer,2,"op",sVar1._M_len);
  ASTSerializer::write(serializer,4,"left",(size_t)this->left);
  ASTSerializer::write(serializer,5,"right",(size_t)this->right);
  return;
}

Assistant:

void BinaryAssertionExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.write("op", toString(op));
    serializer.write("left", left);
    serializer.write("right", right);
}